

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RadixSort.cpp
# Opt level: O2

void srs::radixSort(vector<Graph::Edge,_std::allocator<Graph::Edge>_> *A)

{
  uint64_t *puVar1;
  undefined8 *puVar2;
  value_type *__value;
  pointer pEVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  pointer extraout_RAX;
  pointer pEVar7;
  long lVar8;
  byte bVar9;
  long lVar10;
  vector<Graph::Edge,_std::allocator<Graph::Edge>_> *__range2;
  Edge *i;
  pointer pEVar11;
  ulong uVar12;
  unsigned_long uVar13;
  u64 deg;
  long lVar14;
  bool bVar15;
  _Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_> local_848;
  array<unsigned_long,_256UL> B;
  
  __value = (A->super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>)._M_impl.
            super__Vector_impl_data._M_start;
  std::vector<Graph::Edge,_std::allocator<Graph::Edge>_>::vector
            ((vector<Graph::Edge,_std::allocator<Graph::Edge>_> *)&local_848,
             (long)(A->super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)__value >> 5,__value,
             (allocator_type *)&B);
  pEVar7 = extraout_RAX;
  for (lVar14 = 0; lVar14 != 8; lVar14 = lVar14 + 1) {
    memset(&B,0,0x800);
    pEVar3 = (A->super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    bVar9 = (char)lVar14 * '\b';
    pEVar7 = (A->super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>)._M_impl.
             super__Vector_impl_data._M_start;
    for (pEVar11 = pEVar7; lVar8 = 1, pEVar11 != pEVar3; pEVar11 = pEVar11 + 1) {
      B._M_elems[pEVar11->shift >> (bVar9 & 0x3f) & 0xff] =
           B._M_elems[pEVar11->shift >> (bVar9 & 0x3f) & 0xff] + 1;
    }
    for (; lVar8 != 0x100; lVar8 = lVar8 + 1) {
      B._M_elems[lVar8] = B._M_elems[lVar8] + B._M_elems[lVar8 + -1];
    }
    lVar8 = (long)pEVar3 - (long)pEVar7;
    lVar10 = lVar8 >> 5;
    lVar8 = lVar8 + -8;
    while (bVar15 = lVar10 != 0, lVar10 = lVar10 + -1, bVar15) {
      pEVar7 = (A->super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar12 = *(ulong *)((long)&(pEVar7->super_LightEdge).u + lVar8) >> (bVar9 & 0x3f) & 0xff;
      uVar13 = B._M_elems[uVar12] - 1;
      B._M_elems[uVar12] = uVar13;
      puVar1 = (uint64_t *)((long)pEVar7 + lVar8 + -0x18);
      uVar4 = *puVar1;
      uVar5 = puVar1[1];
      puVar2 = (undefined8 *)((long)pEVar7 + lVar8 + -8);
      uVar6 = puVar2[1];
      *(undefined8 *)&local_848._M_impl.super__Vector_impl_data._M_start[uVar13].finished = *puVar2;
      *(uint64_t *)(&local_848._M_impl.super__Vector_impl_data._M_start[uVar13].finished + 8) =
           uVar6;
      local_848._M_impl.super__Vector_impl_data._M_start[uVar13].super_LightEdge.u = uVar4;
      local_848._M_impl.super__Vector_impl_data._M_start[uVar13].super_LightEdge.v = uVar5;
      lVar8 = lVar8 + -0x20;
    }
    pEVar7 = (A->super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pEVar3 = (A->super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    pEVar11 = (A->super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    (A->super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>)._M_impl.
    super__Vector_impl_data._M_start = local_848._M_impl.super__Vector_impl_data._M_start;
    (A->super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>)._M_impl.
    super__Vector_impl_data._M_finish = local_848._M_impl.super__Vector_impl_data._M_finish;
    (A->super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_848._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_848._M_impl.super__Vector_impl_data._M_finish = pEVar3;
    local_848._M_impl.super__Vector_impl_data._M_start = pEVar7;
    local_848._M_impl.super__Vector_impl_data._M_end_of_storage = pEVar11;
  }
  local_848._M_impl.super__Vector_impl_data._M_start = pEVar7;
  std::_Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>::~_Vector_base(&local_848);
  return;
}

Assistant:

void srs::radixSort(std::vector<Graph::Edge> &A) {
    std::vector<Graph::Edge> R(A.size(), A[0]);
    for (u64 deg = 0; deg < Digits; ++deg) {
        std::array<u64, Variants> B{};

        for (auto &i : A)
            ++B[ind(i.shift, deg)];

        for (u64 i = 1; i < B.size(); ++i)
            B[i] += B[i - 1];

        for (u64 i = A.size(); i--;)
            R[--B[ind(A[i].shift, deg)]] = A[i];
        std::swap(A, R);
    }
}